

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode vtls_shutdown_blocking(Curl_cfilter *cf,Curl_easy *data,_Bool send_shutdown,_Bool *done)

{
  void *pvVar1;
  undefined8 uVar2;
  int iVar3;
  timediff_t timeout_ms_00;
  uint *puVar4;
  bool bVar5;
  byte local_69;
  int local_58;
  int loop;
  int what;
  timediff_t timeout_ms;
  CURLcode result;
  cf_call_data save;
  ssl_connect_data *connssl;
  _Bool *done_local;
  _Bool send_shutdown_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  timeout_ms._4_4_ = CURLE_OK;
  local_58 = 10;
  if (((byte)cf->field_0x24 >> 1 & 1) == 0) {
    uVar2 = *(undefined8 *)((long)cf->ctx + 0x38);
    *(Curl_easy **)((long)cf->ctx + 0x38) = data;
    *done = false;
    do {
      do {
        bVar5 = false;
        if ((timeout_ms._4_4_ == CURLE_OK) && (bVar5 = false, (*done & 1U) == 0)) {
          bVar5 = local_58 != 0;
          local_58 = local_58 + -1;
        }
        if (!bVar5) goto LAB_001bb882;
        timeout_ms_00 = Curl_shutdown_timeleft(cf->conn,cf->sockindex,(curltime *)0x0);
        if (timeout_ms_00 < 0) {
          Curl_failf(data,"SSL shutdown timeout");
          return CURLE_OPERATION_TIMEDOUT;
        }
        timeout_ms._4_4_ = (*Curl_ssl->shut_down)(cf,data,send_shutdown,done);
        if ((timeout_ms._4_4_ != CURLE_OK) || ((*done & 1U) != 0)) goto LAB_001bb882;
      } while (*(int *)((long)pvVar1 + 0xb4) == 0);
      iVar3 = Curl_conn_cf_poll(cf,data,timeout_ms_00);
      if (iVar3 < 0) {
        puVar4 = (uint *)__errno_location();
        Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar4);
        timeout_ms._4_4_ = CURLE_RECV_ERROR;
        goto LAB_001bb882;
      }
    } while (iVar3 != 0);
    Curl_failf(data,"SSL shutdown timeout");
    timeout_ms._4_4_ = CURLE_OPERATION_TIMEDOUT;
LAB_001bb882:
    *(undefined8 *)((long)cf->ctx + 0x38) = uVar2;
    local_69 = 1;
    if (timeout_ms._4_4_ == CURLE_OK) {
      local_69 = *done;
    }
    cf->field_0x24 = cf->field_0x24 & 0xfd | (local_69 & 1) << 1;
    cf_local._4_4_ = timeout_ms._4_4_;
  }
  else {
    *done = true;
    cf_local._4_4_ = CURLE_OK;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode vtls_shutdown_blocking(struct Curl_cfilter *cf,
                                       struct Curl_easy *data,
                                       bool send_shutdown, bool *done)
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct cf_call_data save;
  CURLcode result = CURLE_OK;
  timediff_t timeout_ms;
  int what, loop = 10;

  if(cf->shutdown) {
    *done = TRUE;
    return CURLE_OK;
  }
  CF_DATA_SAVE(save, cf, data);

  *done = FALSE;
  while(!result && !*done && loop--) {
    timeout_ms = Curl_shutdown_timeleft(cf->conn, cf->sockindex, NULL);

    if(timeout_ms < 0) {
      /* no need to continue if time is already up */
      failf(data, "SSL shutdown timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = Curl_ssl->shut_down(cf, data, send_shutdown, done);
    if(result ||*done)
      goto out;

    if(connssl->io_need) {
      what = Curl_conn_cf_poll(cf, data, timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        result = CURLE_RECV_ERROR;
        goto out;
      }
      else if(0 == what) {
        /* timeout */
        failf(data, "SSL shutdown timeout");
        result = CURLE_OPERATION_TIMEDOUT;
        goto out;
      }
      /* socket is readable or writable */
    }
  }
out:
  CF_DATA_RESTORE(cf, save);
  cf->shutdown = (result || *done);
  return result;
}